

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O2

bool __thiscall
wasm::SimplifyLocals<false,_false,_false>::runLateOptimizations
          (SimplifyLocals<false,_false,_false> *this,Function *func)

{
  undefined1 local_340 [8];
  EquivalentOptimizer eqOpter;
  UnneededSetRemover setRemover;
  
  LocalGetCounter::analyze(&this->getCounter,func);
  runLateOptimizations::EquivalentOptimizer::EquivalentOptimizer((EquivalentOptimizer *)local_340);
  eqOpter._224_8_ =
       (this->
       super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
       ).
       super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
       .
       super_PostWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
       .
       super_Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
       .currModule;
  PassOptions::operator=
            ((PassOptions *)&eqOpter.module,
             &((this->
               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
               ).super_Pass.runner)->options);
  eqOpter.
  super_LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>.
  super_PostWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>.
  super_Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>.currModule =
       (Module *)&(this->getCounter).num;
  eqOpter.numLocalGets._0_1_ = 0;
  Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::walkFunction
            ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)local_340,
             func);
  if (eqOpter.passOptions.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._1_1_ == '\x01') {
    ReFinalize::ReFinalize((ReFinalize *)&eqOpter.equivalences.indexSets._M_h._M_single_bucket);
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
              ((Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> *)
               ((long)(setRemover.
                       super_PostWalker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>
                       .
                       super_Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>
                       .stack.fixed._M_elems + 1) + 8),func,
               (this->
               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
               ).
               super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
               .
               super_PostWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
               .
               super_Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
               .currModule);
    ReFinalize::~ReFinalize((ReFinalize *)&eqOpter.equivalences.indexSets._M_h._M_single_bucket);
  }
  UnneededSetRemover::UnneededSetRemover
            ((UnneededSetRemover *)&eqOpter.equivalences.indexSets._M_h._M_single_bucket,
             &this->getCounter,func,
             &((this->
               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
               ).super_Pass.runner)->options,
             (this->
             super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
             ).
             super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
             .
             super_PostWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
             .
             super_Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
             .currModule);
  setRemover.
  super_PostWalker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>.
  super_Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>.
  currFunction = (Function *)
                 (this->
                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
                 ).
                 super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                 .
                 super_PostWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                 .
                 super_Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                 .currModule;
  std::
  _Vector_base<wasm::Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>::Task,_std::allocator<wasm::Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>::Task>_>
  ::~_Vector_base((_Vector_base<wasm::Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>::Task,_std::allocator<wasm::Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>::Task>_>
                   *)((long)(setRemover.
                             super_PostWalker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>
                             .
                             super_Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>
                             .stack.fixed._M_elems + 9) + 8));
  runLateOptimizations::EquivalentOptimizer::~EquivalentOptimizer((EquivalentOptimizer *)local_340);
  return (bool)(((byte)setRemover.module |
                (byte)eqOpter.passOptions.funcEffectsMap.
                      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi) & 1);
}

Assistant:

bool runLateOptimizations(Function* func) {
    // Finally, after optimizing a function we can do some additional
    // optimization.
    getCounter.analyze(func);
    // Remove equivalent copies - assignment of
    // a local to another local that already contains that value. Note that
    // we do that at the very end, and only after structure, as removing
    // the copy here:
    //   (if
    //    (local.get $var$0)
    //    (local.set $var$0
    //     (local.get $var$0)
    //    )
    //    (local.set $var$0
    //     (i32.const 208)
    //    )
    //   )
    // will inhibit us creating an if return value.
    struct EquivalentOptimizer
      : public LinearExecutionWalker<EquivalentOptimizer> {
      std::vector<Index>* numLocalGets;
      bool removeEquivalentSets;
      Module* module;
      PassOptions passOptions;

      bool anotherCycle = false;
      bool refinalize = false;

      // We track locals containing the same value.
      EquivalentSets equivalences;

      static void doNoteNonLinear(EquivalentOptimizer* self,
                                  Expression** currp) {
        // TODO do this across non-linear paths too, in coalesce-locals perhaps?
        //      (would inhibit structure opts here, though.
        self->equivalences.clear();
      }

      void visitLocalSet(LocalSet* curr) {
        // Remove trivial copies, even through a tee
        auto* value =
          Properties::getFallthrough(curr->value, passOptions, *module);
        if (auto* get = value->template dynCast<LocalGet>()) {
          if (equivalences.check(curr->index, get->index)) {
            // This is an unnecessary copy!
            if (removeEquivalentSets) {
              if (curr->isTee()) {
                this->replaceCurrent(curr->value);
              } else {
                this->replaceCurrent(Builder(*module).makeDrop(curr->value));
              }
              anotherCycle = true;
            }
            // Nothing more to do, ignore the copy.
            return;
          } else {
            // There is a new equivalence now. Remove all the old ones, and add
            // the new one.
            equivalences.reset(curr->index);
            equivalences.add(curr->index, get->index);
            return;
          }
        }
        // A new value of some kind is assigned here, and it's not something we
        // could handle earlier, so remove all the old equivalent ones.
        equivalences.reset(curr->index);
      }

      void visitLocalGet(LocalGet* curr) {
        // Canonicalize gets: if some are equivalent, then we can pick more
        // then one, and other passes may benefit from having more uniformity.
        if (auto* set = equivalences.getEquivalents(curr->index)) {
          // Helper method that returns the # of gets *ignoring the current
          // get*, as we want to see what is best overall, treating this one as
          // to be decided upon.
          auto getNumGetsIgnoringCurr = [&](Index index) {
            auto ret = (*numLocalGets)[index];
            if (index == curr->index) {
              assert(ret >= 1);
              ret--;
            }
            return ret;
          };

          // Pick the index with the most uses - maximizing the chance to
          // lower one's uses to zero. If types differ though then we prefer to
          // switch to a more refined type even if there are fewer uses, as that
          // may have significant benefits to later optimizations (we may be
          // able to use it to remove casts, etc.).
          auto* func = this->getFunction();
          Index best = -1;
          for (auto index : *set) {
            if (best == Index(-1)) {
              // This is the first possible option we've seen.
              best = index;
              continue;
            }

            auto bestType = func->getLocalType(best);
            auto indexType = func->getLocalType(index);
            if (!Type::isSubType(indexType, bestType)) {
              // This is less refined than the current best; ignore.
              continue;
            }

            // This is better if it has a more refined type, or if it has more
            // uses.
            if (indexType != bestType ||
                getNumGetsIgnoringCurr(index) > getNumGetsIgnoringCurr(best)) {
              best = index;
            }
          }
          assert(best != Index(-1));
          // Due to ordering, the best index may be different from us but have
          // the same # of locals - make sure we actually improve, either adding
          // more gets, or a more refined type (and never change to a less
          // refined type).
          auto bestType = func->getLocalType(best);
          auto oldType = func->getLocalType(curr->index);
          if (best != curr->index && Type::isSubType(bestType, oldType)) {
            auto hasMoreGets = getNumGetsIgnoringCurr(best) >
                               getNumGetsIgnoringCurr(curr->index);
            if (hasMoreGets || bestType != oldType) {
              // Update the get counts.
              (*numLocalGets)[best]++;
              assert((*numLocalGets)[curr->index] >= 1);
              (*numLocalGets)[curr->index]--;
              // Make the change.
              curr->index = best;
              anotherCycle = true;
              if (bestType != oldType) {
                curr->type = func->getLocalType(best);
                // We are switching to a more refined type, which might require
                // changes in the user of the local.get.
                refinalize = true;
              }
            }
          }
        }
      }
    };

    EquivalentOptimizer eqOpter;
    eqOpter.module = this->getModule();
    eqOpter.passOptions = this->getPassOptions();
    eqOpter.numLocalGets = &getCounter.num;
    eqOpter.removeEquivalentSets = allowStructure;
    eqOpter.walkFunction(func);
    if (eqOpter.refinalize) {
      ReFinalize().walkFunctionInModule(func, this->getModule());
    }

    // We may have already had a local with no uses, or we may have just
    // gotten there thanks to the EquivalentOptimizer. If there are such
    // locals, remove all their sets.
    UnneededSetRemover setRemover(
      getCounter, func, this->getPassOptions(), *this->getModule());
    setRemover.setModule(this->getModule());

    return eqOpter.anotherCycle || setRemover.removed;
  }